

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# apply-names.cc
# Opt level: O3

Result wabt::ApplyNames(Module *module)

{
  Var *var_00;
  Module *func;
  pointer pTVar1;
  pointer pTVar2;
  char *pcVar3;
  ElemSegment *pEVar4;
  pointer pVVar5;
  DataSegment *pDVar6;
  Result RVar7;
  Index IVar8;
  pointer ppFVar9;
  pointer ppGVar10;
  Var *pVVar11;
  pointer ppEVar12;
  Table *pTVar13;
  pointer ppDVar14;
  Memory *pMVar15;
  Var *var_01;
  ulong uVar16;
  Enum EVar17;
  Var *var;
  pointer var_02;
  string_view name;
  string_view name_00;
  Delegate local_c8;
  NameApplier applier;
  
  local_c8._vptr_Delegate = (_func_int **)&PTR__NameApplier_01543c70;
  applier.super_DelegateNop.super_Delegate._vptr_Delegate = (Delegate)(_func_int **)0x0;
  applier.module_ = (Module *)0x0;
  ExprVisitor::ExprVisitor((ExprVisitor *)&applier.current_func_,&local_c8);
  applier.labels_.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  applier.labels_.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  applier.param_and_local_index_to_name_.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  applier.param_and_local_index_to_name_.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  applier.visitor_.expr_iter_stack_.
  super__Vector_base<wabt::intrusive_list<wabt::Expr>::iterator,_std::allocator<wabt::intrusive_list<wabt::Expr>::iterator>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  applier.param_and_local_index_to_name_.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  ppFVar9 = (module->funcs).super__Vector_base<wabt::Func_*,_std::allocator<wabt::Func_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  applier.super_DelegateNop.super_Delegate._vptr_Delegate = (Delegate)(Delegate)module;
  if ((module->funcs).super__Vector_base<wabt::Func_*,_std::allocator<wabt::Func_*>_>._M_impl.
      super__Vector_impl_data._M_finish != ppFVar9) {
    uVar16 = 0;
    do {
      func = (Module *)ppFVar9[uVar16];
      applier.module_ = func;
      if (((FuncDeclaration *)&func->name)->has_func_type == true) {
        RVar7 = anon_unknown_7::NameApplier::UseNameForFuncTypeVar
                          ((NameApplier *)applier.super_DelegateNop.super_Delegate._vptr_Delegate,
                           &((FuncDeclaration *)&func->name)->type_var);
        if (RVar7.enum_ == Error) goto LAB_00f28df0;
      }
      pTVar1 = (((FuncSignature *)&func->excepts)->param_types).
               super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
               super__Vector_impl_data._M_start;
      pTVar2 = (((FuncSignature *)&func->excepts)->param_types).
               super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
               super__Vector_impl_data._M_finish;
      IVar8 = LocalTypes::size((LocalTypes *)&func->globals);
      MakeTypeBindingReverseMapping
                ((ulong)(IVar8 + (int)((ulong)((long)pTVar2 - (long)pTVar1) >> 2)),
                 (BindingHash *)&func->imports,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&applier.visitor_.expr_iter_stack_.
                     super__Vector_base<wabt::intrusive_list<wabt::Expr>::iterator,_std::allocator<wabt::intrusive_list<wabt::Expr>::iterator>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage);
      RVar7 = ExprVisitor::VisitFunc((ExprVisitor *)&applier.current_func_,(Func *)func);
      if (RVar7.enum_ == Error) goto LAB_00f28df0;
      applier.module_ = (Module *)0x0;
      uVar16 = uVar16 + 1;
      ppFVar9 = (module->funcs).super__Vector_base<wabt::Func_*,_std::allocator<wabt::Func_*>_>.
                _M_impl.super__Vector_impl_data._M_start;
    } while (uVar16 < (ulong)((long)(module->funcs).
                                    super__Vector_base<wabt::Func_*,_std::allocator<wabt::Func_*>_>.
                                    _M_impl.super__Vector_impl_data._M_finish - (long)ppFVar9 >> 3))
    ;
  }
  ppGVar10 = (module->globals).super__Vector_base<wabt::Global_*,_std::allocator<wabt::Global_*>_>.
             _M_impl.super__Vector_impl_data._M_start;
  if ((module->globals).super__Vector_base<wabt::Global_*,_std::allocator<wabt::Global_*>_>._M_impl.
      super__Vector_impl_data._M_finish != ppGVar10) {
    uVar16 = 0;
    do {
      RVar7 = ExprVisitor::VisitExprList
                        ((ExprVisitor *)&applier.current_func_,&ppGVar10[uVar16]->init_expr);
      if (RVar7.enum_ == Error) goto LAB_00f28df0;
      uVar16 = uVar16 + 1;
      ppGVar10 = (module->globals).
                 super__Vector_base<wabt::Global_*,_std::allocator<wabt::Global_*>_>._M_impl.
                 super__Vector_impl_data._M_start;
    } while (uVar16 < (ulong)((long)(module->globals).
                                    super__Vector_base<wabt::Global_*,_std::allocator<wabt::Global_*>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)ppGVar10 >> 3
                             ));
  }
  pVVar11 = (Var *)(module->exports).
                   super__Vector_base<wabt::Export_*,_std::allocator<wabt::Export_*>_>._M_impl.
                   super__Vector_impl_data._M_start;
  var_01 = (Var *)(module->exports).
                  super__Vector_base<wabt::Export_*,_std::allocator<wabt::Export_*>_>._M_impl.
                  super__Vector_impl_data._M_finish;
  if (var_01 != pVVar11) {
    uVar16 = 0;
    do {
      pcVar3 = (&(pVVar11->loc).filename.data_)[uVar16];
      if (*(int *)(pcVar3 + 0x20) == 0) {
        anon_unknown_7::NameApplier::UseNameForFuncVar
                  ((NameApplier *)applier.super_DelegateNop.super_Delegate._vptr_Delegate,
                   (Var *)(pcVar3 + 0x28));
        pVVar11 = (Var *)(module->exports).
                         super__Vector_base<wabt::Export_*,_std::allocator<wabt::Export_*>_>._M_impl
                         .super__Vector_impl_data._M_start;
        var_01 = (Var *)(module->exports).
                        super__Vector_base<wabt::Export_*,_std::allocator<wabt::Export_*>_>._M_impl.
                        super__Vector_impl_data._M_finish;
      }
      uVar16 = uVar16 + 1;
    } while (uVar16 < (ulong)((long)var_01 - (long)pVVar11 >> 3));
  }
  ppEVar12 = (module->elem_segments).
             super__Vector_base<wabt::ElemSegment_*,_std::allocator<wabt::ElemSegment_*>_>._M_impl.
             super__Vector_impl_data._M_start;
  if ((module->elem_segments).
      super__Vector_base<wabt::ElemSegment_*,_std::allocator<wabt::ElemSegment_*>_>._M_impl.
      super__Vector_impl_data._M_finish != ppEVar12) {
    pVVar11 = (Var *)0x0;
    EVar17 = Error;
    do {
      pEVar4 = ppEVar12[(long)pVVar11];
      pTVar13 = Module::GetTable((Module *)applier.super_DelegateNop.super_Delegate._vptr_Delegate,
                                 &pEVar4->table_var);
      if (pTVar13 == (Table *)0x0) goto LAB_00f28df6;
      name.size_ = (size_type)&pEVar4->table_var;
      name.data_ = (char *)(pTVar13->name)._M_string_length;
      anon_unknown_7::NameApplier::UseNameForVar
                ((NameApplier *)(pTVar13->name)._M_dataplus._M_p,name,var_01);
      RVar7 = ExprVisitor::VisitExprList((ExprVisitor *)&applier.current_func_,&pEVar4->offset);
      if (RVar7.enum_ == Error) goto LAB_00f28df6;
      pVVar5 = (pEVar4->vars).super__Vector_base<wabt::Var,_std::allocator<wabt::Var>_>._M_impl.
               super__Vector_impl_data._M_finish;
      for (var_02 = (pEVar4->vars).super__Vector_base<wabt::Var,_std::allocator<wabt::Var>_>._M_impl
                    .super__Vector_impl_data._M_start; var_02 != pVVar5; var_02 = var_02 + 1) {
        RVar7 = anon_unknown_7::NameApplier::UseNameForFuncVar
                          ((NameApplier *)applier.super_DelegateNop.super_Delegate._vptr_Delegate,
                           var_02);
        if (RVar7.enum_ == Error) goto LAB_00f28df6;
      }
      pVVar11 = (Var *)((long)&(pVVar11->loc).filename.data_ + 1);
      ppEVar12 = (module->elem_segments).
                 super__Vector_base<wabt::ElemSegment_*,_std::allocator<wabt::ElemSegment_*>_>.
                 _M_impl.super__Vector_impl_data._M_start;
      var_01 = (Var *)((long)(module->elem_segments).
                             super__Vector_base<wabt::ElemSegment_*,_std::allocator<wabt::ElemSegment_*>_>
                             ._M_impl.super__Vector_impl_data._M_finish - (long)ppEVar12 >> 3);
    } while (pVVar11 < var_01);
  }
  ppDVar14 = (module->data_segments).
             super__Vector_base<wabt::DataSegment_*,_std::allocator<wabt::DataSegment_*>_>._M_impl.
             super__Vector_impl_data._M_start;
  if ((module->data_segments).
      super__Vector_base<wabt::DataSegment_*,_std::allocator<wabt::DataSegment_*>_>._M_impl.
      super__Vector_impl_data._M_finish != ppDVar14) {
    pVVar11 = (Var *)0x0;
    EVar17 = Error;
    do {
      pDVar6 = ppDVar14[(long)pVVar11];
      var_00 = &pDVar6->memory_var;
      pMVar15 = Module::GetMemory((Module *)applier.super_DelegateNop.super_Delegate._vptr_Delegate,
                                  var_00);
      if (pMVar15 == (Memory *)0x0) goto LAB_00f28df6;
      name_00.size_ = (size_type)var_00;
      name_00.data_ = (char *)(pMVar15->name)._M_string_length;
      anon_unknown_7::NameApplier::UseNameForVar
                ((NameApplier *)(pMVar15->name)._M_dataplus._M_p,name_00,var_01);
      RVar7 = ExprVisitor::VisitExprList((ExprVisitor *)&applier.current_func_,&pDVar6->offset);
      if (RVar7.enum_ == Error) goto LAB_00f28df6;
      pVVar11 = (Var *)((long)&(pVVar11->loc).filename.data_ + 1);
      ppDVar14 = (module->data_segments).
                 super__Vector_base<wabt::DataSegment_*,_std::allocator<wabt::DataSegment_*>_>.
                 _M_impl.super__Vector_impl_data._M_start;
      var_01 = (Var *)((long)(module->data_segments).
                             super__Vector_base<wabt::DataSegment_*,_std::allocator<wabt::DataSegment_*>_>
                             ._M_impl.super__Vector_impl_data._M_finish - (long)ppDVar14 >> 3);
    } while (pVVar11 < var_01);
  }
  applier.super_DelegateNop.super_Delegate._vptr_Delegate = (Delegate)(_func_int **)0x0;
  EVar17 = Ok;
LAB_00f28df6:
  local_c8._vptr_Delegate = (_func_int **)&PTR__NameApplier_01543c70;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&applier.param_and_local_index_to_name_.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&applier.visitor_.expr_iter_stack_.
                super__Vector_base<wabt::intrusive_list<wabt::Expr>::iterator,_std::allocator<wabt::intrusive_list<wabt::Expr>::iterator>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
  if (applier.visitor_.expr_stack_.super__Vector_base<wabt::Expr_*,_std::allocator<wabt::Expr_*>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
    operator_delete(applier.visitor_.expr_stack_.
                    super__Vector_base<wabt::Expr_*,_std::allocator<wabt::Expr_*>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage);
  }
  if (applier.visitor_.state_stack_.
      super__Vector_base<wabt::ExprVisitor::State,_std::allocator<wabt::ExprVisitor::State>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
    operator_delete(applier.visitor_.state_stack_.
                    super__Vector_base<wabt::ExprVisitor::State,_std::allocator<wabt::ExprVisitor::State>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
  }
  if (applier.visitor_.delegate_ != (Delegate *)0x0) {
    operator_delete(applier.visitor_.delegate_);
  }
  return (Result)EVar17;
LAB_00f28df0:
  EVar17 = Error;
  goto LAB_00f28df6;
}

Assistant:

Result ApplyNames(Module* module) {
  NameApplier applier;
  return applier.VisitModule(module);
}